

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

void ED25519_keypair_from_seed(uint8_t *out_public_key,uint8_t *out_private_key,uint8_t *seed)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  byte local_108 [31];
  byte local_e9;
  ge_p3 A;
  
  SHA512(seed,0x20,local_108);
  local_108[0] = local_108[0] & 0xf8;
  local_e9 = local_e9 & 0x3f | 0x40;
  x25519_ge_scalarmult_base(&A,local_108);
  ge_p3_tobytes(out_public_key,&A);
  uVar1 = *(undefined8 *)seed;
  uVar2 = *(undefined8 *)(seed + 8);
  uVar3 = *(undefined8 *)(seed + 0x18);
  *(undefined8 *)(out_private_key + 0x10) = *(undefined8 *)(seed + 0x10);
  *(undefined8 *)(out_private_key + 0x18) = uVar3;
  *(undefined8 *)out_private_key = uVar1;
  *(undefined8 *)(out_private_key + 8) = uVar2;
  uVar1 = *(undefined8 *)(out_public_key + 8);
  uVar2 = *(undefined8 *)(out_public_key + 0x10);
  uVar3 = *(undefined8 *)(out_public_key + 0x18);
  *(undefined8 *)(out_private_key + 0x20) = *(undefined8 *)out_public_key;
  *(undefined8 *)(out_private_key + 0x28) = uVar1;
  *(undefined8 *)(out_private_key + 0x30) = uVar2;
  *(undefined8 *)(out_private_key + 0x38) = uVar3;
  return;
}

Assistant:

void ED25519_keypair_from_seed(uint8_t out_public_key[32],
                               uint8_t out_private_key[64],
                               const uint8_t seed[32]) {
  uint8_t az[SHA512_DIGEST_LENGTH];
  SHA512(seed, 32, az);

  az[0] &= 248;
  az[31] &= 127;
  az[31] |= 64;

  ge_p3 A;
  x25519_ge_scalarmult_base(&A, az);
  ge_p3_tobytes(out_public_key, &A);
  // The public key is derived from the private key, but it is public.
  CONSTTIME_DECLASSIFY(out_public_key, 32);

  OPENSSL_memcpy(out_private_key, seed, 32);
  OPENSSL_memcpy(out_private_key + 32, out_public_key, 32);
}